

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufAdd(xmlBufPtr buf,xmlChar *str,int len)

{
  int iVar1;
  ulong size;
  size_t needSize;
  int len_local;
  xmlChar *str_local;
  xmlBufPtr buf_local;
  
  if (((str == (xmlChar *)0x0) || (buf == (xmlBufPtr)0x0)) || (buf->error != 0)) {
    buf_local._4_4_ = -1;
  }
  else {
    if ((buf->size != (ulong)buf->compat_size) && (buf->compat_size < 0x7fffffff)) {
      buf->size = (ulong)buf->compat_size;
    }
    if ((buf->use != (ulong)buf->compat_use) && (buf->compat_use < 0x7fffffff)) {
      buf->use = (ulong)buf->compat_use;
    }
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
      buf_local._4_4_ = -1;
    }
    else if (len < -1) {
      buf_local._4_4_ = -1;
    }
    else if (len == 0) {
      buf_local._4_4_ = 0;
    }
    else {
      needSize._4_4_ = len;
      if (len < 0) {
        needSize._4_4_ = xmlStrlen(str);
      }
      if (needSize._4_4_ < 0) {
        buf_local._4_4_ = -1;
      }
      else if (needSize._4_4_ == 0) {
        buf_local._4_4_ = 0;
      }
      else {
        if (buf->size - buf->use <= (ulong)(long)needSize._4_4_) {
          if (-buf->use - 1 <= (ulong)(long)needSize._4_4_) {
            xmlBufMemoryError(buf,"growing buffer past SIZE_MAX");
            return -1;
          }
          size = buf->use + (long)needSize._4_4_ + 1;
          if ((buf->alloc == XML_BUFFER_ALLOC_BOUNDED) && (9999999 < size)) {
            xmlBufMemoryError(buf,"buffer error: text too long\n");
            return -1;
          }
          iVar1 = xmlBufResize(buf,size);
          if (iVar1 == 0) {
            xmlBufMemoryError(buf,"growing buffer");
            return 2;
          }
        }
        memmove(buf->content + buf->use,str,(long)needSize._4_4_);
        buf->use = (long)needSize._4_4_ + buf->use;
        buf->content[buf->use] = '\0';
        if (buf->size < 0x7fffffff) {
          buf->compat_size = (uint)buf->size;
        }
        else {
          buf->compat_size = 0x7fffffff;
        }
        if (buf->use < 0x7fffffff) {
          buf->compat_use = (uint)buf->use;
        }
        else {
          buf->compat_use = 0x7fffffff;
        }
        buf_local._4_4_ = 0;
      }
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufAdd(xmlBufPtr buf, const xmlChar *str, int len) {
    size_t needSize;

    if ((str == NULL) || (buf == NULL) || (buf->error))
	return -1;
    CHECK_COMPAT(buf)

    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return -1;
    if (len < -1) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufAdd: len < 0\n");
#endif
	return -1;
    }
    if (len == 0) return 0;

    if (len < 0)
        len = xmlStrlen(str);

    if (len < 0) return -1;
    if (len == 0) return 0;

    /* Note that both buf->size and buf->use can be zero here. */
    if ((size_t) len >= buf->size - buf->use) {
        if ((size_t) len >= SIZE_MAX - buf->use) {
            xmlBufMemoryError(buf, "growing buffer past SIZE_MAX");
            return(-1);
        }
        needSize = buf->use + len + 1;
	if (buf->alloc == XML_BUFFER_ALLOC_BOUNDED) {
	    /*
	     * Used to provide parsing limits
	     */
	    if (needSize >= XML_MAX_TEXT_LENGTH) {
		xmlBufMemoryError(buf, "buffer error: text too long\n");
		return(-1);
	    }
	}
        if (!xmlBufResize(buf, needSize)){
	    xmlBufMemoryError(buf, "growing buffer");
            return XML_ERR_NO_MEMORY;
        }
    }

    memmove(&buf->content[buf->use], str, len);
    buf->use += len;
    buf->content[buf->use] = 0;
    UPDATE_COMPAT(buf)
    return 0;
}